

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProperty.cc
# Opt level: O2

void __thiscall OpenMesh::BaseProperty::stats(BaseProperty *this,ostream *_ostr)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(_ostr,"  ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name_);
  pcVar2 = "";
  if (this->persistent_ != false) {
    pcVar2 = ", persistent ";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void BaseProperty::stats(std::ostream& _ostr) const
{
  _ostr << "  " << name() << (persistent() ? ", persistent " : "") << "\n";
}